

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_thr.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint __line;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *__s;
  char *pcVar5;
  size_t __size;
  
  if (argc != 4) {
    puts("usage: remote_thr <connect-to> <msg-size> <msg-count>");
    return 1;
  }
  pcVar5 = argv[1];
  iVar1 = atoi(argv[2]);
  iVar2 = atoi(argv[3]);
  iVar3 = nn_socket(1,0x10);
  if (iVar3 == -1) {
    pcVar5 = "s != -1";
    __line = 0x33;
  }
  else {
    iVar4 = nn_connect(iVar3,pcVar5);
    if (iVar4 < 0) {
      pcVar5 = "rc >= 0";
      __line = 0x35;
    }
    else {
      __size = (size_t)iVar1;
      __s = malloc(__size);
      if (__s == (void *)0x0) {
        pcVar5 = "buf";
        __line = 0x38;
      }
      else {
        memset(__s,0x6f,__size);
        iVar4 = nn_send(iVar3,__s,0,0);
        if (iVar4 == 0) {
          iVar2 = iVar2 + 1;
          do {
            iVar2 = iVar2 + -1;
            if (iVar2 == 0) {
              free(__s);
              iVar1 = nn_close(iVar3);
              if (iVar1 == 0) {
                return 0;
              }
              pcVar5 = "rc == 0";
              __line = 0x46;
              goto LAB_0010128e;
            }
            iVar4 = nn_send(iVar3,__s,__size,0);
          } while (iVar4 == iVar1);
          pcVar5 = "nbytes == (int)sz";
          __line = 0x40;
        }
        else {
          pcVar5 = "nbytes == 0";
          __line = 0x3c;
        }
      }
    }
  }
LAB_0010128e:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_thr.c"
                ,__line,"int main(int, char **)");
}

Assistant:

int main (int argc, char *argv [])
{
    const char *connect_to;
    size_t sz;
    int count;
    char *buf;
    int nbytes;
    int s;
    int rc;
    int i;

    if (argc != 4) {
        printf ("usage: remote_thr <connect-to> <msg-size> <msg-count>\n");
        return 1;
    }
    connect_to = argv [1];
    sz = atoi (argv [2]);
    count = atoi (argv [3]);

    s = nn_socket (AF_SP, NN_PAIR);
    assert (s != -1);
    rc = nn_connect (s, connect_to);
    assert (rc >= 0);

    buf = malloc (sz);
    assert (buf);
    memset (buf, 111, sz);

    nbytes = nn_send (s, buf, 0, 0);
    assert (nbytes == 0);

    for (i = 0; i != count; i++) {
        nbytes = nn_send (s, buf, sz, 0);
        assert (nbytes == (int)sz);
    }

    free (buf);

    rc = nn_close (s);
    assert (rc == 0);

    return 0;
}